

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>::alloc
          (array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_> *this
          ,int new_len)

{
  CCountryFlag *p;
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  CCountryFlag *pCVar4;
  long lVar5;
  
  this->list_size = new_len;
  pCVar4 = allocator_default<CCountryFlags::CCountryFlag>::alloc_array(new_len);
  uVar1 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar1 = this->num_elements;
  }
  lVar5 = 0;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (; p = this->list, (ulong)uVar1 * 0x14 - lVar5 != 0; lVar5 = lVar5 + 0x14) {
    *(undefined4 *)(pCVar4->m_aCountryCodeString + lVar5 + 0xc) =
         *(undefined4 *)(p->m_aCountryCodeString + lVar5 + 0xc);
    uVar2 = *(undefined8 *)(p->m_aCountryCodeString + lVar5 + -4 + 8);
    *(undefined8 *)(pCVar4->m_aCountryCodeString + lVar5 + -4) =
         *(undefined8 *)(p->m_aCountryCodeString + lVar5 + -4);
    *(undefined8 *)(pCVar4->m_aCountryCodeString + lVar5 + -4 + 8) = uVar2;
  }
  allocator_default<CCountryFlags::CCountryFlag>::free_array(p);
  iVar3 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar3 = this->num_elements;
  }
  this->num_elements = iVar3;
  this->list = pCVar4;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}